

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O1

void __thiscall LSM_tree::recover(LSM_tree *this)

{
  pointer *pppLVar1;
  pointer *ppppVar2;
  path *this_00;
  bool bVar3;
  char cVar4;
  Level *this_01;
  Sstable *pSVar5;
  ostream *poVar6;
  uint uVar7;
  LSM_tree *in_RSI;
  LSM_tree *this_02;
  iterator __position;
  _List_node_base *p_Var8;
  bool del;
  Level *my_level;
  uint my_timer;
  uint offset;
  string file_name;
  pairs *my_pair;
  uint64_t key;
  string level_name;
  ifstream in;
  bool local_2b9;
  ulong local_2b8;
  uint local_2ac;
  Level *local_2a8;
  uint local_2a0;
  uint local_29c;
  LSM_tree local_298;
  uint64_t local_260;
  undefined1 local_258 [64];
  byte abStack_218 [488];
  
  local_2b8 = 0;
  this_00 = (path *)(local_258 + 0x20);
  local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
  super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)this;
  do {
    __position._M_current = (Level **)local_258;
    get_level_name_abi_cxx11_((string *)__position._M_current,in_RSI,(int)local_2b8);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __position._M_current,auto_format);
    cVar4 = std::filesystem::status(this_00);
    std::filesystem::__cxx11::path::~path(this_00);
    bVar3 = false;
    if ((cVar4 != '\0') && (cVar4 != -1)) {
      this_01 = (Level *)operator_new(0x28);
      Level::Level(this_01,(int)local_2b8);
      __position._M_current =
           (((vector<Level_*,_std::allocator<Level_*>_> *)
            &(local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
              super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next)->
           super__Vector_base<Level_*,_std::allocator<Level_*>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      local_2a8 = this_01;
      if (__position._M_current ==
          (((vector<Level_*,_std::allocator<Level_*>_> *)
           &(local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
             super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
             super__List_node_base._M_next)->_M_next)->
          super__Vector_base<Level_*,_std::allocator<Level_*>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Level*,std::allocator<Level*>>::_M_realloc_insert<Level*const&>
                  ((vector<Level*,std::allocator<Level*>> *)
                   local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                   super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                   super__List_node_base._M_next,__position,&local_2a8);
      }
      else {
        *__position._M_current = this_01;
        pppLVar1 = &(((vector<Level_*,_std::allocator<Level_*>_> *)
                     &(local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                       super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                       super__List_node_base._M_next)->_M_next)->
                    super__Vector_base<Level_*,_std::allocator<Level_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppLVar1 = *pppLVar1 + 1;
      }
      local_2ac = (int)local_2b8 + 1;
      if (local_2ac != 0x1f) {
        uVar7 = 1 << ((byte)local_2ac & 0x1f);
        if ((int)uVar7 < 2) {
          uVar7 = 1;
        }
        local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
        super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
        super__List_node_base._M_prev = (_List_node_base *)(ulong)uVar7;
        p_Var8 = (_List_node_base *)0x0;
        this_02 = (LSM_tree *)__position._M_current;
        do {
          __position._M_current = (Level **)&local_298;
          get_file_name_abi_cxx11_
                    ((string *)__position._M_current,this_02,(int)local_2b8,(int)p_Var8);
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __position._M_current,auto_format);
          cVar4 = std::filesystem::status(this_00);
          std::filesystem::__cxx11::path::~path(this_00);
          if ((cVar4 == -1) || (cVar4 == '\0')) {
            local_2a8->is_creat[(long)p_Var8] = false;
          }
          else {
            local_2a8->is_creat[(long)p_Var8] = true;
            std::ifstream::ifstream(this_00,(string *)&local_298,_S_in|_S_bin);
            cVar4 = std::__basic_file<char>::is_open();
            if (cVar4 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Error:open file",0xf);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,
                                  (char *)local_298.disk.
                                          super__Vector_base<Level_*,_std::allocator<Level_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_298.disk.
                                        super__Vector_base<Level_*,_std::allocator<Level_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish);
              std::endl<char,std::char_traits<char>>(poVar6);
              exit(0);
            }
            pSVar5 = (Sstable *)operator_new(0x20);
            (pSVar5->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
            super__Vector_impl_data._M_start = 0;
            *(pointer *)
             ((long)&(pSVar5->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl
             + 8) = (pointer)0x0;
            *(pointer *)
             ((long)&(pSVar5->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl
             + 0x10) = (pointer)0x0;
            pSVar5->end = 0;
            std::istream::seekg((long)this_00,0x200000);
            std::istream::tellg();
            std::istream::read((char *)this_00,(long)pSVar5);
            std::istream::tellg();
            __position._M_current = (Level **)0x200004;
            std::istream::seekg((long)this_00,0x200004);
            std::istream::tellg();
            if ((abStack_218[(long)((_List_node_base *)(local_258._32_8_ + -0x20))->_M_prev] & 2) ==
                0) {
              do {
                std::istream::tellg();
                std::istream::read((char *)this_00,(long)&local_260);
                std::istream::tellg();
                std::istream::read((char *)this_00,(long)&local_29c);
                std::istream::tellg();
                std::istream::read((char *)this_00,(long)&local_2a0);
                std::istream::tellg();
                std::istream::read((char *)this_00,(long)&local_2b9);
                std::istream::tellg();
                local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size =
                     (size_t)operator_new(0x18);
                ((pairs *)
                local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size)->
                key = local_260;
                ((pairs *)
                local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size)->
                offset = local_29c;
                ((pairs *)
                local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size)->
                timer = local_2a0;
                ((pairs *)
                local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size)->
                del = local_2b9;
                __position._M_current =
                     *(Level ***)
                      ((long)&(pSVar5->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>
                              ._M_impl + 8);
                if (__position._M_current ==
                    (Level **)
                    *(pointer *)
                     ((long)&(pSVar5->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>.
                             _M_impl + 0x10)) {
                  std::vector<pairs*,std::allocator<pairs*>>::_M_realloc_insert<pairs*const&>
                            ((vector<pairs*,std::allocator<pairs*>> *)&pSVar5->buffer,
                             (iterator)__position._M_current,
                             (pairs **)
                             ((long)&local_298.memtable.
                                     super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                                     super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>.
                                     _M_impl._M_node + 0x10));
                }
                else {
                  *__position._M_current =
                       (Level *)local_298.memtable.
                                super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                                super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl.
                                _M_node._M_size;
                  ppppVar2 = (pointer *)
                             ((long)&(pSVar5->buffer).
                                     super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl +
                             8);
                  *ppppVar2 = *ppppVar2 + 1;
                }
              } while ((abStack_218[(long)((_List_node_base *)(local_258._32_8_ + -0x20))->_M_prev]
                       & 2) == 0);
            }
            std::ifstream::close();
            (local_2a8->file).super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
            super__Vector_impl_data._M_start[(long)p_Var8] = pSVar5;
            std::ifstream::~ifstream(this_00);
          }
          if (local_298.disk.super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&local_298.disk.super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage) {
            __position._M_current =
                 (Level **)
                 ((long)local_298.disk.super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage + 1);
            operator_delete(local_298.disk.super__Vector_base<Level_*,_std::allocator<Level_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,(ulong)__position._M_current);
          }
          p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
          this_02 = (LSM_tree *)__position._M_current;
        } while (p_Var8 != local_298.memtable.super_list<Quadlist_*,_std::allocator<Quadlist_*>_>.
                           super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node
                           .super__List_node_base._M_prev);
      }
      bVar3 = true;
      local_2b8 = (ulong)local_2ac;
    }
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      __position._M_current = (Level **)(local_258._16_8_ + 1);
      operator_delete((void *)local_258._0_8_,(ulong)__position._M_current);
    }
    in_RSI = (LSM_tree *)__position._M_current;
  } while (bVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"recover finished\n",0x11);
  return;
}

Assistant:

void LSM_tree::recover() {
    int level_id=0;


    while(true)
    {
        std::string level_name=get_level_name(level_id);
        if(!fs::exists(level_name)) break;
        Level* my_level=new Level(level_id);
        disk.push_back(my_level);

        //看看这层由上面文件 读一下
        for(int file_id=0;file_id<(1<<(level_id+1));file_id++)
        {
            std::string file_name=get_file_name(level_id,file_id);
            //如果这个文件存在 就都进去
            if(!fs::exists(file_name)){
                my_level->is_creat[file_id]=false;
                continue;
            }
            else my_level->is_creat[file_id]=true;

            //打开文件
            ifstream in(file_name, ios::in | ios::binary);
            if (!in.is_open()) {
                cout << "Error:open file" << file_name << endl;
                exit(0);
            }

            //新建索引区
            Sstable * my_sstable =new Sstable;
            //找到索引区起始位置
            in.seekg(INDEX_BEGIN,ios::beg);
            int o4=in.tellg();
            in.read((char*)&my_sstable->end, sizeof(unsigned int));
           int o5=in.tellg();
            in.seekg(INDEX_BEGIN+ sizeof(unsigned int),ios::beg);
            int o6=in.tellg();
            while (!in.eof())
            {
                uint64_t key;
                unsigned int offset;
                unsigned int my_timer;
                bool del;

                int o0=in.tellg();
                in.read((char*)&key,sizeof(uint64_t));
                int o1=in.tellg();
                in.read((char*)&offset,sizeof(unsigned int));
                int o2=in.tellg();
                in.read((char*)&my_timer, sizeof(unsigned int));
                int o3=in.tellg();
                in.read((char*)&del,sizeof(bool));
                int o4=in.tellg();

                pairs* my_pair=new pairs(key,offset,my_timer,del);
                my_sstable->buffer.push_back(my_pair);
            }
            in.close();

            //把sstable写进level
            my_level->file[file_id]=my_sstable;



        }
        level_id++;

    }

    cout<<"recover finished\n";

}